

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cc
# Opt level: O3

void kratos::GeneratorPortVisitor::process_port(Generator *generator,Port *port,string *port_name)

{
  vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
  *pvVar1;
  pointer ppVar2;
  char cVar3;
  int iVar4;
  uint uVar5;
  undefined4 extraout_var;
  long lVar6;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  Var *pVVar7;
  const_iterator cVar8;
  Generator *pGVar9;
  long lVar10;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  InternalException *this;
  GeneratorException *pGVar11;
  undefined1 auVar12 [8];
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  long *plVar13;
  pointer ppVar14;
  bool bVar15;
  shared_ptr<kratos::PortPackedStruct> sVar16;
  string_view format_str;
  string_view format_str_00;
  format_args args;
  format_args args_00;
  initializer_list<kratos::IRNode_*> __l;
  initializer_list<kratos::IRNode_*> __l_00;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  local_e8;
  undefined1 local_c8 [8];
  shared_ptr<kratos::Var> var;
  string new_name;
  undefined1 auStack_88 [16];
  undefined1 auStack_78 [8];
  shared_ptr<kratos::PortPackedStruct> packed_1;
  allocator_type local_59;
  undefined1 auStack_58 [8];
  shared_ptr<kratos::PortPackedStruct> packed;
  undefined1 local_38 [8];
  
  if (port->direction_ != Out) {
    if (port->direction_ != In) {
      this = (InternalException *)__cxa_allocate_exception(0x10);
      var.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&new_name._M_string_length;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)
                 &var.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                 "Not implement yet","");
      InternalException::InternalException
                (this,(string *)
                      &var.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      __cxa_throw(this,&InternalException::typeinfo,std::runtime_error::~runtime_error);
    }
    iVar4 = (*(port->super_Var).super_IRNode._vptr_IRNode[0x10])(port);
    if (*(long *)(CONCAT44(extraout_var,iVar4) + 0x18) == 1) {
      lVar10 = *(long *)(CONCAT44(extraout_var,iVar4) + 0x10);
      lVar6 = (**(code **)(**(long **)(lVar10 + 8) + 0x20))();
      if ((*(int *)(lVar6 + 0x48) != 0) || (*(Port **)(*(long *)(lVar10 + 8) + 0xc0) != port))
      goto LAB_001e399e;
      pvVar1 = *(vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
                 **)(*(long *)(lVar10 + 8) + 200);
      iVar4 = *(int *)(pvVar1 + 0x168);
      auVar12 = (undefined1  [8])pvVar1;
      if (iVar4 == 6) {
        Var::as<kratos::VarCasted>
                  ((Var *)&var.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount);
        auVar12 = (undefined1  [8])
                  *(vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
                    **)&var.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                        _M_pi[0x27]._M_use_count;
        if (new_name._M_dataplus._M_p != (pointer)0x0) {
          local_38 = (undefined1  [8])
                     *(vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
                       **)&var.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi[0x27]._M_use_count;
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)new_name._M_dataplus._M_p);
          auVar12 = local_38;
        }
        iVar4 = *(int *)((long)auVar12 + 0x168);
      }
      switch(iVar4) {
      case 0:
      case 3:
      case 5:
        goto switchD_001e3d21_caseD_0;
      case 4:
        local_38 = (undefined1  [8])(**(code **)(*(long *)auVar12 + 0x20))(auVar12);
        iVar4 = (*(generator->super_IRNode)._vptr_IRNode[4])(generator);
        if (local_38 == (undefined1  [8])CONCAT44(extraout_var_06,iVar4))
        goto switchD_001e3d21_caseD_0;
      }
      if (*(int *)(pvVar1 + 0x168) == 2) {
        local_38 = (undefined1  [8])(**(code **)(*(long *)pvVar1 + 0x68))(pvVar1);
        iVar4 = (*(generator->super_IRNode)._vptr_IRNode[4])(generator);
        if (local_38 == (undefined1  [8])CONCAT44(extraout_var_07,iVar4)) {
switchD_001e3d21_caseD_0:
          pGVar9 = (Generator *)(**(code **)(*(long *)pvVar1 + 0x68))(pvVar1);
          var.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar10 + 8);
          new_name._M_dataplus._M_p = *(pointer *)(lVar10 + 0x10);
          if (new_name._M_dataplus._M_p != (pointer)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(int *)(new_name._M_dataplus._M_p + 8) = *(int *)(new_name._M_dataplus._M_p + 8) + 1;
              UNLOCK();
            }
            else {
              *(int *)(new_name._M_dataplus._M_p + 8) = *(int *)(new_name._M_dataplus._M_p + 8) + 1;
            }
          }
          Generator::remove_stmt
                    (pGVar9,(shared_ptr<kratos::Stmt> *)
                            &var.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount);
          if (new_name._M_dataplus._M_p == (pointer)0x0) {
            return;
          }
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)new_name._M_dataplus._M_p);
          return;
        }
      }
    }
LAB_001e399e:
    iVar4 = (*(generator->super_IRNode)._vptr_IRNode[4])(generator);
    pGVar9 = (Generator *)CONCAT44(extraout_var_00,iVar4);
    if (pGVar9 == (Generator *)0x0) {
      pGVar11 = (GeneratorException *)__cxa_allocate_exception(0x10);
      auStack_58 = (undefined1  [8])(generator->name)._M_dataplus._M_p;
      packed.super___shared_ptr<kratos::PortPackedStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)(generator->name)._M_string_length;
      format_str.size_ = 0xd;
      format_str.data_ = (char *)0x2f;
      args.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .field_1.args_ = in_R9.args_;
      args.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .desc_ = (unsigned_long_long)auStack_58;
      fmt::v7::detail::vformat_abi_cxx11_
                ((string *)
                 &var.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                 (detail *)"{0}\'s parent is empty but it\'s not a top module",format_str,args);
      __l._M_len = 1;
      __l._M_array = (iterator)auStack_78;
      auStack_78 = (undefined1  [8])generator;
      std::vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>::vector
                ((vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> *)auStack_58,__l,
                 (allocator_type *)&local_e8);
      GeneratorException::GeneratorException
                (pGVar11,(string *)
                         &var.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount,
                 (vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> *)auStack_58);
      __cxa_throw(pGVar11,&GeneratorException::typeinfo,std::runtime_error::~runtime_error);
    }
    Generator::get_unique_variable_name
              ((string *)
               &var.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount,pGVar9,
               &generator->instance_name,port_name);
    iVar4 = (*(port->super_Var).super_IRNode._vptr_IRNode[0x17])(port);
    if ((char)iVar4 == '\0') {
      pVVar7 = Generator::var(pGVar9,(string *)
                                     &var.
                                      super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>.
                                      _M_refcount,(port->super_Var).var_width_,
                              &(port->super_Var).size_,(port->super_Var).is_signed_);
      uVar5 = (*(port->super_Var).super_IRNode._vptr_IRNode[0x18])(port);
      (*(pVVar7->super_IRNode)._vptr_IRNode[0x19])(pVVar7,(ulong)(uVar5 & 0xff));
      pVVar7->explicit_array_ = (port->super_Var).explicit_array_;
    }
    else {
      sVar16 = Var::as<kratos::PortPackedStruct>((Var *)auStack_58);
      (**(code **)(*(long *)auStack_58 + 0x170))
                (auStack_78,auStack_58,
                 sVar16.super___shared_ptr<kratos::PortPackedStruct,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi._M_pi);
      Generator::var_packed
                (pGVar9,(string *)
                        &var.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                 ,(shared_ptr<kratos::PackedStruct> *)auStack_78);
      if (packed_1.super___shared_ptr<kratos::PortPackedStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr
          != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   packed_1.super___shared_ptr<kratos::PortPackedStruct,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr);
      }
      if (packed.super___shared_ptr<kratos::PortPackedStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   packed.super___shared_ptr<kratos::PortPackedStruct,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr);
      }
    }
    Generator::get_var((Generator *)auStack_58,(string *)pGVar9);
    auVar12 = auStack_58;
    if (packed.super___shared_ptr<kratos::PortPackedStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 packed.super___shared_ptr<kratos::PortPackedStruct,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr);
    }
    if ((process_port(kratos::Generator*,kratos::Port*,std::__cxx11::string_const&)::cast_maps ==
         '\0') &&
       (iVar4 = __cxa_guard_acquire(&process_port(kratos::Generator*,kratos::Port*,std::__cxx11::string_const&)
                                     ::cast_maps), iVar4 != 0)) {
      packed.super___shared_ptr<kratos::PortPackedStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x500000003;
      auStack_58 = (undefined1  [8])0x200000001;
      packed.super___shared_ptr<kratos::PortPackedStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x300000002;
      std::
      _Hashtable<kratos::PortType,std::pair<kratos::PortType_const,kratos::VarCastType>,std::allocator<std::pair<kratos::PortType_const,kratos::VarCastType>>,std::__detail::_Select1st,std::equal_to<kratos::PortType>,std::hash<kratos::PortType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::_Hashtable<std::pair<kratos::PortType_const,kratos::VarCastType>const*>
                ((_Hashtable<kratos::PortType,std::pair<kratos::PortType_const,kratos::VarCastType>,std::allocator<std::pair<kratos::PortType_const,kratos::VarCastType>>,std::__detail::_Select1st,std::equal_to<kratos::PortType>,std::hash<kratos::PortType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)&process_port::cast_maps,auStack_58,local_38,0,auStack_78,&local_e8,local_c8);
      __cxa_atexit(std::
                   unordered_map<kratos::PortType,_kratos::VarCastType,_std::hash<kratos::PortType>,_std::equal_to<kratos::PortType>,_std::allocator<std::pair<const_kratos::PortType,_kratos::VarCastType>_>_>
                   ::~unordered_map,&process_port::cast_maps,&__dso_handle);
      __cxa_guard_release(&process_port(kratos::Generator*,kratos::Port*,std::__cxx11::string_const&)
                           ::cast_maps);
    }
    auStack_58._0_4_ = port->type_;
    cVar8 = std::
            _Hashtable<kratos::PortType,_std::pair<const_kratos::PortType,_kratos::VarCastType>,_std::allocator<std::pair<const_kratos::PortType,_kratos::VarCastType>_>,_std::__detail::_Select1st,_std::equal_to<kratos::PortType>,_std::hash<kratos::PortType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&process_port::cast_maps._M_h,(key_type *)auStack_58);
    if (cVar8.
        super__Node_iterator_base<std::pair<const_kratos::PortType,_kratos::VarCastType>,_false>.
        _M_cur != (__node_type *)0x0) {
      auStack_78._0_4_ = port->type_;
      cVar8 = std::
              _Hashtable<kratos::PortType,_std::pair<const_kratos::PortType,_kratos::VarCastType>,_std::allocator<std::pair<const_kratos::PortType,_kratos::VarCastType>_>,_std::__detail::_Select1st,_std::equal_to<kratos::PortType>,_std::hash<kratos::PortType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&process_port::cast_maps._M_h,(key_type *)auStack_78);
      if (cVar8.
          super__Node_iterator_base<std::pair<const_kratos::PortType,_kratos::VarCastType>,_false>.
          _M_cur == (__node_type *)0x0) {
        std::__throw_out_of_range("_Map_base::at");
      }
      Var::cast((Var *)auStack_58,auVar12._0_4_);
      auVar12 = auStack_58;
      if (packed.super___shared_ptr<kratos::PortPackedStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   packed.super___shared_ptr<kratos::PortPackedStruct,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr);
      }
    }
    if (pGVar9->debug == true) {
      std::
      vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
      ::
      vector<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string,unsigned_int>*,std::vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>>,void>
                ((vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
                  *)auStack_78,
                 (port->super_Var).super_IRNode.fn_name_ln.
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 (port->super_Var).super_IRNode.fn_name_ln.
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,(allocator_type *)&local_e8);
      local_38 = (undefined1  [8])&(((Var *)auVar12)->super_IRNode).fn_name_ln;
      auStack_58 = (undefined1  [8])
                   (((Var *)auVar12)->super_IRNode).fn_name_ln.
                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
      packed.super___shared_ptr<kratos::PortPackedStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           (((Var *)auVar12)->super_IRNode).fn_name_ln.
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      packed.super___shared_ptr<kratos::PortPackedStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              (((Var *)auVar12)->super_IRNode).fn_name_ln.
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
      (((Var *)auVar12)->super_IRNode).fn_name_ln.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)auStack_78;
      (((Var *)auVar12)->super_IRNode).fn_name_ln.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (pointer)packed_1.
                    super___shared_ptr<kratos::PortPackedStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      (((Var *)auVar12)->super_IRNode).fn_name_ln.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)packed_1.
                    super___shared_ptr<kratos::PortPackedStruct,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
      auStack_78 = (undefined1  [8])0x0;
      packed_1.super___shared_ptr<kratos::PortPackedStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      packed_1.super___shared_ptr<kratos::PortPackedStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
      ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                 *)auStack_58);
      std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
      ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                 *)auStack_78);
      auStack_58 = (undefined1  [8])0x24a6df;
      packed.super___shared_ptr<kratos::PortPackedStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           CONCAT44(packed.super___shared_ptr<kratos::PortPackedStruct,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr._4_4_,0x194);
      std::
      vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
      ::emplace_back<std::pair<char_const*,int>>
                ((vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
                  *)local_38,(pair<const_char_*,_int> *)auStack_58);
    }
    Var::move_src_to(&port->super_Var,(Var *)auVar12,pGVar9,true);
    if (var.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&new_name._M_string_length) {
      operator_delete(var.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                      _M_pi,new_name._M_string_length + 1);
    }
    return;
  }
  local_38 = (undefined1  [8])port_name;
  iVar4 = (*(port->super_Var).super_IRNode._vptr_IRNode[0xe])(port);
  var.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_88;
  new_name._M_dataplus._M_p = (pointer)0x1;
  new_name._M_string_length = 0;
  new_name.field_2._M_allocated_capacity = 0;
  new_name.field_2._8_4_ = 0x3f800000;
  auStack_88._0_8_ = (_func_int **)0x0;
  plVar13 = *(long **)(CONCAT44(extraout_var_01,iVar4) + 0x10);
  if (plVar13 == (long *)0x0) goto LAB_001e4002;
  do {
    pGVar9 = Stmt::generator_parent((Stmt *)plVar13[1]);
    iVar4 = (*(port->super_Var).super_IRNode._vptr_IRNode[0xd])(port);
    if (pGVar9 == *(Generator **)(CONCAT44(extraout_var_02,iVar4) + 0x2d0)) {
      std::
      _Hashtable<std::shared_ptr<kratos::AssignStmt>,std::shared_ptr<kratos::AssignStmt>,std::allocator<std::shared_ptr<kratos::AssignStmt>>,std::__detail::_Identity,std::equal_to<std::shared_ptr<kratos::AssignStmt>>,std::hash<std::shared_ptr<kratos::AssignStmt>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::_M_emplace<std::shared_ptr<kratos::AssignStmt>const&>
                ((_Hashtable<std::shared_ptr<kratos::AssignStmt>,std::shared_ptr<kratos::AssignStmt>,std::allocator<std::shared_ptr<kratos::AssignStmt>>,std::__detail::_Identity,std::equal_to<std::shared_ptr<kratos::AssignStmt>>,std::hash<std::shared_ptr<kratos::AssignStmt>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)&var.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                 plVar13 + 1);
    }
    plVar13 = (long *)*plVar13;
  } while (plVar13 != (long *)0x0);
  if (new_name.field_2._M_allocated_capacity == 0) goto LAB_001e4002;
  if (new_name.field_2._M_allocated_capacity == 1) {
    plVar13 = *(long **)(new_name._M_string_length + 8);
    auStack_88._8_8_ = *(long *)(new_name._M_string_length + 0x10);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_88._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_88._8_8_)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_88._8_8_)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_88._8_8_)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_88._8_8_)->_M_use_count + 1;
      }
    }
    ppVar2 = (pointer)plVar13[0x18];
    cVar3 = (**(code **)((ppVar2->first)._M_dataplus._M_p + 0xe8))(ppVar2);
    if (cVar3 == '\0') {
      iVar4 = *(int *)&ppVar2[9].first._M_dataplus._M_p;
      ppVar14 = ppVar2;
      if (iVar4 == 6) {
        Var::as<kratos::VarCasted>((Var *)auStack_58);
        ppVar14 = (((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                     *)((long)auStack_58 + 0x278))->
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        if (packed.super___shared_ptr<kratos::PortPackedStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     packed.super___shared_ptr<kratos::PortPackedStruct,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr);
        }
        iVar4 = *(int *)&ppVar14[9].first._M_dataplus._M_p;
      }
      switch(iVar4) {
      case 0:
      case 3:
      case 5:
        goto switchD_001e3dd9_caseD_0;
      default:
        bVar15 = true;
        break;
      case 4:
        lVar10 = (**(code **)((ppVar14->first)._M_dataplus._M_p + 0x20))(ppVar14);
        iVar4 = (*(generator->super_IRNode)._vptr_IRNode[4])(generator);
        bVar15 = lVar10 != CONCAT44(extraout_var_05,iVar4);
      }
    }
    else {
switchD_001e3dd9_caseD_0:
      bVar15 = false;
    }
    lVar10 = (**(code **)(*plVar13 + 0x20))(plVar13);
    if (!bVar15 && *(int *)(lVar10 + 0x48) == 0) {
      lVar10 = (**(code **)((ppVar2->first)._M_dataplus._M_p + 0x68))(ppVar2);
      iVar4 = (*(generator->super_IRNode)._vptr_IRNode[4])(generator);
      if ((lVar10 == CONCAT44(extraout_var_03,iVar4)) && ((Port *)plVar13[0x19] == port)) {
        (**(code **)(*plVar13 + 0x48))(plVar13);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_88._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_88._8_8_);
        }
        goto LAB_001e4002;
      }
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_88._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_88._8_8_);
    }
  }
  iVar4 = (*(generator->super_IRNode)._vptr_IRNode[4])(generator);
  pGVar9 = (Generator *)CONCAT44(extraout_var_04,iVar4);
  if (pGVar9 == (Generator *)0x0) {
    pGVar11 = (GeneratorException *)__cxa_allocate_exception(0x10);
    auStack_78 = (undefined1  [8])(generator->name)._M_dataplus._M_p;
    packed_1.super___shared_ptr<kratos::PortPackedStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)(generator->name)._M_string_length;
    format_str_00.size_ = 0xd;
    format_str_00.data_ = (char *)0x2f;
    args_00.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.args_ = in_R9.args_;
    args_00.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)auStack_78;
    fmt::v7::detail::vformat_abi_cxx11_
              ((string *)auStack_58,(detail *)"{0}\'s parent is empty but it\'s not a top module",
               format_str_00,args_00);
    __l_00._M_len = 1;
    __l_00._M_array = (iterator)&local_e8;
    local_e8.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)generator;
    std::vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>::vector
              ((vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> *)auStack_78,__l_00,
               (allocator_type *)local_c8);
    GeneratorException::GeneratorException
              (pGVar11,(string *)auStack_58,
               (vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> *)auStack_78);
    __cxa_throw(pGVar11,&GeneratorException::typeinfo,std::runtime_error::~runtime_error);
  }
  Generator::get_unique_variable_name
            ((string *)auStack_58,pGVar9,&generator->instance_name,(string *)local_38);
  iVar4 = (*(port->super_Var).super_IRNode._vptr_IRNode[0x17])(port);
  if ((char)iVar4 == '\0') {
    pVVar7 = Generator::var(pGVar9,(string *)auStack_58,(port->super_Var).var_width_,
                            &(port->super_Var).size_,(port->super_Var).is_signed_);
    uVar5 = (*(port->super_Var).super_IRNode._vptr_IRNode[0x18])(port);
    (*(pVVar7->super_IRNode)._vptr_IRNode[0x19])(pVVar7,(ulong)(uVar5 & 0xff));
    pVVar7->explicit_array_ = (port->super_Var).explicit_array_;
  }
  else {
    sVar16 = Var::as<kratos::PortPackedStruct>((Var *)auStack_78);
    (**(code **)((((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_78)
                 ->_M_dataplus)._M_p + 0x170))
              (&local_e8,auStack_78,
               sVar16.super___shared_ptr<kratos::PortPackedStruct,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi._M_pi);
    Generator::var_packed(pGVar9,(string *)auStack_58,(shared_ptr<kratos::PackedStruct> *)&local_e8)
    ;
    if (local_e8.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
        ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_e8.
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
    }
    if (packed_1.super___shared_ptr<kratos::PortPackedStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 packed_1.super___shared_ptr<kratos::PortPackedStruct,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr);
    }
  }
  Generator::get_var((Generator *)local_c8,(string *)pGVar9);
  if (pGVar9->debug == true) {
    std::
    vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
    ::
    vector<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string,unsigned_int>*,std::vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>>,void>
              ((vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
                *)&local_e8,
               (port->super_Var).super_IRNode.fn_name_ln.
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               (port->super_Var).super_IRNode.fn_name_ln.
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,&local_59);
    auStack_78 = (undefined1  [8])
                 (((IRNode *)local_c8)->fn_name_ln).
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
    packed_1.super___shared_ptr<kratos::PortPackedStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         (((IRNode *)local_c8)->fn_name_ln).
         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    packed_1.super___shared_ptr<kratos::PortPackedStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            (((IRNode *)local_c8)->fn_name_ln).
            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (((IRNode *)local_c8)->fn_name_ln).
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         local_e8.
         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (((IRNode *)local_c8)->fn_name_ln).
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_e8.
         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (((IRNode *)local_c8)->fn_name_ln).
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_e8.
         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_e8.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_e8.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_e8.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
    ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
               *)auStack_78);
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
    ::~vector(&local_e8);
    auStack_78 = (undefined1  [8])0x24a6df;
    packed_1.super___shared_ptr<kratos::PortPackedStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         CONCAT44(packed_1.super___shared_ptr<kratos::PortPackedStruct,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr._4_4_,0x1cd);
    std::
    vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
    ::emplace_back<std::pair<char_const*,int>>
              ((vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
                *)&((IRNode *)local_c8)->fn_name_ln,(pair<const_char_*,_int> *)auStack_78);
  }
  Var::move_sink_to(&port->super_Var,(Var *)local_c8,pGVar9,true);
  if (var.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0)
  {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               var.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  if (auStack_58 !=
      (undefined1  [8])
      &packed.super___shared_ptr<kratos::PortPackedStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  {
    operator_delete((void *)auStack_58,
                    (ulong)((long)&(packed.
                                    super___shared_ptr<kratos::PortPackedStruct,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount._M_pi)->_vptr__Sp_counted_base + 1));
  }
LAB_001e4002:
  std::
  _Hashtable<std::shared_ptr<kratos::AssignStmt>,_std::shared_ptr<kratos::AssignStmt>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>,_std::__detail::_Identity,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<std::shared_ptr<kratos::AssignStmt>,_std::shared_ptr<kratos::AssignStmt>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>,_std::__detail::_Identity,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&var.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

static void process_port(Generator* generator, Port* port, const std::string& port_name) {
        auto const port_direction = port->port_direction();
        if (port_direction == PortDirection::In) {
            const auto& sources = port->sources();
            // unless it's driven by a single var or port, we need to duplicate
            // the variable
            if (sources.size() == 1) {
                const auto& stmt = *sources.begin();
                if (stmt->parent()->ir_node_kind() == IRNodeKind::GeneratorKind &&
                    stmt->left() == port) {
                    // the sink has to be it self
                    auto* src = stmt->right();
                    if (correct_src_type(src, generator) ||
                        // here we are okay with input sliced in
                        (src->type() == VarType::Slice &&
                         src->generator() == generator->parent())) {
                        // remove it from the parent generator
                        src->generator()->remove_stmt(stmt);
                        return;
                    }
                }
            }
            // create a new variable
            auto* ast_parent = generator->parent();
            if (!ast_parent)
                throw GeneratorException(
                    ::format("{0}'s parent is empty but it's not a top module", generator->name),
                    {generator});
            auto* parent = reinterpret_cast<Generator*>(ast_parent);
            auto new_name = parent->get_unique_variable_name(generator->instance_name, port_name);
            if (port->is_struct()) {
                auto packed = port->as<PortPackedStruct>();
                parent->var_packed(new_name, packed->packed_struct());
            } else {
                auto& v = parent->var(new_name, port->var_width(), port->size(), port->is_signed());
                v.set_is_packed(port->is_packed());
                v.set_explicit_array(port->explicit_array());
            }
            Var* var = parent->get_var(new_name).get();
            // be careful about the port type. if it's special type, it needs properly casted
            const static std::unordered_map<PortType, VarCastType> cast_maps = {
                {PortType::Clock, VarCastType::Clock},
                {PortType::AsyncReset, VarCastType::AsyncReset},
                {PortType::Reset, VarCastType::Reset},
                {PortType::ClockEnable, VarCastType::ClockEnable}};
            if (cast_maps.find(port->port_type()) != cast_maps.end()) {
                var = var->cast(cast_maps.at(port->port_type())).get();
            }
            if (parent->debug) {
                // need to copy over the changes over
                var->fn_name_ln = std::vector<std::pair<std::string, uint32_t>>(
                    port->fn_name_ln.begin(), port->fn_name_ln.end());
                var->fn_name_ln.emplace_back(std::make_pair(__FILE__, __LINE__));
            }
            // replace all the sources
            Var::move_src_to(port, var, parent, true);
        } else if (port_direction == PortDirection::Out) {
            // same logic as the port dir in
            // if we're connected to a base variable, we are good
            const auto& sinks_ = port->sinks();
            // we are only interested in parent level port connection
            std::unordered_set<std::shared_ptr<AssignStmt>> sinks;
            for (auto const& stmt : sinks_) {
                if (stmt->generator_parent() == port->generator()->parent_generator())
                    sinks.emplace(stmt);
            }
            if (sinks.empty()) {
                return;
            }
            // special case where if the sink is parent's port, this is fine
            if (sinks.size() == 1) {
                auto stmt = *(sinks.begin());
                auto* src = stmt->left();
                bool correct_src_type_;
                if (!src->is_interface()) {
                    // as long as it is not an expression, it is fine
                    correct_src_type_ = correct_src_type(src, generator);
                } else {
                    correct_src_type_ = true;
                }
                if (stmt->parent()->ir_node_kind() == IRNodeKind::GeneratorKind &&
                    correct_src_type_ && src->generator() == generator->parent() &&
                    stmt->right() == port) {
                    // remove it from the parent generator
                    stmt->remove_from_parent();
                    return;
                }
            }
            // create a new variable
            auto* ast_parent = generator->parent();
            if (!ast_parent)
                throw GeneratorException(
                    ::format("{0}'s parent is empty but it's not a top module", generator->name),
                    {generator});
            auto* parent = reinterpret_cast<Generator*>(ast_parent);
            auto new_name = parent->get_unique_variable_name(generator->instance_name, port_name);
            if (port->is_struct()) {
                auto packed = port->as<PortPackedStruct>();
                parent->var_packed(new_name, packed->packed_struct());
            } else {
                auto& v = parent->var(new_name, port->var_width(), port->size(), port->is_signed());
                v.set_is_packed(port->is_packed());
                v.set_explicit_array(port->explicit_array());
            }
            auto var = parent->get_var(new_name);
            if (parent->debug) {
                // need to copy over the changes over
                var->fn_name_ln = std::vector<std::pair<std::string, uint32_t>>(
                    port->fn_name_ln.begin(), port->fn_name_ln.end());
                var->fn_name_ln.emplace_back(std::make_pair(__FILE__, __LINE__));
            }
            // replace all the sources
            Var::move_sink_to(port, var.get(), parent, true);
        } else {
            throw InternalException("Not implement yet");
        }
    }